

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpClient.cpp
# Opt level: O2

HttpResponse * __thiscall
HttpClient::RunRequest
          (HttpResponse *__return_storage_ptr__,HttpClient *this,string *url,string *type)

{
  bool bVar1;
  URL *this_00;
  string *this_01;
  TCPClient client;
  string message;
  string result;
  TCPClient local_391;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  undefined1 *local_350;
  undefined8 local_348;
  undefined1 local_340 [16];
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  string local_170;
  string local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  Log local_50;
  
  this_00 = (URL *)operator_new(0x140);
  std::__cxx11::string::string((string *)&local_70,(string *)url);
  URL::URL(this_00,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
  local_370._M_string_length = 0;
  local_370.field_2._M_local_buf[0] = '\0';
  local_350 = local_340;
  local_348 = 0;
  local_340[0] = 0;
  std::operator+(&local_130,type," ");
  URL::GetRelativePath_abi_cxx11_(&local_150,this_00);
  std::operator+(&local_110,&local_130,&local_150);
  std::operator+(&local_f0,&local_110," HTTP/1.1\r\n");
  std::operator+(&local_d0,&local_f0,"Host: ");
  URL::GetHostName_abi_cxx11_(&local_170,this_00);
  std::operator+(&local_b0,&local_d0,&local_170);
  std::operator+(&local_90,&local_b0,"\r\n");
  std::operator+(&local_390,&local_90,"\r\n");
  std::__cxx11::string::operator=((string *)&local_370,(string *)&local_390);
  std::__cxx11::string::~string((string *)&local_390);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_130);
  URL::GetHostName_abi_cxx11_(&local_390,this_00);
  std::operator+(&local_190,"Making call with hostname: ",&local_390);
  Log::Add(&this->_log,&local_190);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_390);
  URL::GetPortNumber_abi_cxx11_(&local_390,this_00);
  std::operator+(&local_1b0,"Port number: ",&local_390);
  Log::Add(&this->_log,&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_390);
  std::operator+(&local_1d0,"Message: \n",&local_370);
  Log::Add(&this->_log,&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  bVar1 = URL::IsSSL(this_00);
  if (bVar1) {
    std::__cxx11::string::string
              ((string *)&local_1f0,"Use https for the call",(allocator *)&local_390);
    Log::Add(&this->_log,&local_1f0);
    std::__cxx11::string::~string((string *)&local_1f0);
    URL::GetHostName_abi_cxx11_(&local_210,this_00);
    URL::GetPortNumber_abi_cxx11_(&local_230,this_00);
    std::__cxx11::string::string((string *)&local_250,(string *)&local_370);
    TCPClient::SendOverSSL(&local_390,&local_391,&local_210,&local_230,&local_250);
    std::__cxx11::string::operator=((string *)&local_350,(string *)&local_390);
    std::__cxx11::string::~string((string *)&local_390);
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::string::~string((string *)&local_230);
    this_01 = &local_210;
  }
  else {
    std::__cxx11::string::string
              ((string *)&local_270,"Use http for the call",(allocator *)&local_390);
    Log::Add(&this->_log,&local_270);
    std::__cxx11::string::~string((string *)&local_270);
    URL::GetHostName_abi_cxx11_(&local_290,this_00);
    URL::GetPortNumber_abi_cxx11_(&local_2b0,this_00);
    std::__cxx11::string::string((string *)&local_2d0,(string *)&local_370);
    TCPClient::Send(&local_390,&local_391,&local_290,&local_2b0,&local_2d0);
    std::__cxx11::string::operator=((string *)&local_350,(string *)&local_390);
    std::__cxx11::string::~string((string *)&local_390);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::__cxx11::string::~string((string *)&local_2b0);
    this_01 = &local_290;
  }
  std::__cxx11::string::~string((string *)this_01);
  std::__cxx11::string::string
            ((string *)&local_2f0,"Request was made, parsing result",(allocator *)&local_390);
  Log::Add(&this->_log,&local_2f0);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::string((string *)&local_310,(string *)&local_350);
  Log::Log(&local_50,&this->_log);
  HttpResponse::HttpResponse(__return_storage_ptr__,&local_310,this_00,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::string
            ((string *)&local_330,"Response was parsed sucessfully",(allocator *)&local_390);
  Log::Add(&this->_log,&local_330);
  std::__cxx11::string::~string((string *)&local_330);
  std::__cxx11::string::~string((string *)&local_350);
  std::__cxx11::string::~string((string *)&local_370);
  return __return_storage_ptr__;
}

Assistant:

HttpResponse HttpClient::RunRequest(string url, string type) {
  URL* urlObject = new URL(url);
  TCPClient client;
  string message, result;
  message = type + " " + urlObject->GetRelativePath() + " HTTP/1.1\r\n" \
            + "Host: " + urlObject->GetHostName() + "\r\n" \
            + "\r\n";

  _log.Add("Making call with hostname: " + urlObject->GetHostName());
  _log.Add("Port number: " + urlObject->GetPortNumber());
  _log.Add("Message: \n" + message);

  if (urlObject->IsSSL()) {
    _log.Add("Use https for the call");
    result = client.SendOverSSL(urlObject->GetHostName(),
                                urlObject->GetPortNumber(), message);
  } else {
    _log.Add("Use http for the call");
    result = client.Send(urlObject->GetHostName(),
                         urlObject->GetPortNumber(), message);
  }
  _log.Add("Request was made, parsing result");
  HttpResponse response(result, urlObject, _log);
  _log.Add("Response was parsed sucessfully");
  return response;
}